

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

CharItem ** __thiscall
Hpipe::Vec<Hpipe::CharItem_const*>::push_back<Hpipe::CharItem_const*&>
          (Vec<Hpipe::CharItem_const*> *this,CharItem **args)

{
  reference ppCVar1;
  CharItem **args_local;
  Vec<const_Hpipe::CharItem_*> *this_local;
  
  std::vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>>::
  emplace_back<Hpipe::CharItem_const*&>
            ((vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>> *)this,args);
  ppCVar1 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::back
                      ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                       this);
  return ppCVar1;
}

Assistant:

T       *push_back            ( Args &&...args ) { this->emplace_back( std::forward<Args>( args )... ); return &this->back(); }